

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

void __thiscall
Js::RecyclableCollectionObjectWalker<Js::JavascriptSet>::GetChildren
          (RecyclableCollectionObjectWalker<Js::JavascriptSet> *this)

{
  List<Js::RecyclableCollectionObjectWalkerPropertyData<Js::JavascriptSet>,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  bool bVar1;
  void **ppvVar2;
  RecyclableCollectionObjectWalkerPropertyData<Js::JavascriptSet> local_38;
  Var local_30;
  Var value;
  Iterator iterator;
  JavascriptSet *data;
  RecyclableCollectionObjectWalker<Js::JavascriptSet> *this_local;
  
  iterator.current.ptr = (MapOrSetDataNode<void_*> *)VarTo<Js::JavascriptSet>(this->instance);
  JavascriptSet::GetIterator((JavascriptSet *)&value);
  while( true ) {
    bVar1 = MapOrSetDataList<void_*>::Iterator::Next((Iterator *)&value);
    if (!bVar1) break;
    ppvVar2 = MapOrSetDataList<void_*>::Iterator::Current((Iterator *)&value);
    local_30 = *ppvVar2;
    this_00 = this->propertyList;
    RecyclableCollectionObjectWalkerPropertyData<Js::JavascriptSet>::
    RecyclableCollectionObjectWalkerPropertyData(&local_38,local_30);
    JsUtil::
    List<Js::RecyclableCollectionObjectWalkerPropertyData<Js::JavascriptSet>,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
    ::Add(this_00,&local_38);
  }
  return;
}

Assistant:

void RecyclableCollectionObjectWalker<JavascriptSet>::GetChildren()
    {
        JavascriptSet* data = VarTo<JavascriptSet>(instance);
        auto iterator = data->GetIterator();
        while (iterator.Next())
        {
            Var value = iterator.Current();
            propertyList->Add(RecyclableCollectionObjectWalkerPropertyData<JavascriptSet>(value));
        }
    }